

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O1

void __thiscall amrex::MLNodeLinOp::buildMasks(MLNodeLinOp *this)

{
  pointer paVar1;
  __uniq_ptr_data<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>,_true,_true>
  _Var2;
  iMultiFab *piVar3;
  Geometry *geom;
  GpuArray<amrex::LinOpBCType,_3U> bchi;
  FabArrayBase *domain;
  _Head_base<0UL,_amrex::iMultiFab_*,_false> cmf;
  LinOpBCType LVar4;
  LinOpBCType aLVar5 [2];
  LinOpBCType aLVar6 [2];
  int i;
  int iVar7;
  pointer paVar8;
  pointer paVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  pointer *ppbVar13;
  byte bVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  Periodicity PVar26;
  GpuArray<amrex::LinOpBCType,_3U> bclo;
  Box bx;
  MFIter mfi;
  MFItInfo mfi_info;
  iMultiFab ccm;
  Array4<int> local_3b0;
  __uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> local_370;
  FabArrayBase *local_368;
  _Head_base<0UL,_amrex::iMultiFab_*,_false> local_360;
  FabArray<amrex::IArrayBox> *local_358;
  GpuArray<amrex::LinOpBCType,_3U> local_350;
  GpuArray<amrex::LinOpBCType,_3U> local_340;
  _Head_base<0UL,_amrex::iMultiFab_*,_false> local_330;
  ulong local_328;
  pointer local_320;
  LinOpBCType local_318 [2];
  long local_310;
  LinOpBCType local_308;
  LinOpBCType local_304;
  LinOpBCType local_300;
  LinOpBCType local_2fc;
  LinOpBCType local_2f8;
  LinOpBCType local_2f4;
  int local_2f0;
  int local_2ec;
  undefined8 local_2e8;
  undefined4 local_2e0;
  LinOpBCType local_2dc [2];
  undefined8 uStack_2d4;
  long local_2c0;
  long local_2b8;
  MLNodeLinOp *local_2b0;
  undefined1 local_2a8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  int local_280;
  Vector<int,_std::allocator<int>_> *local_270;
  MFItInfo local_244;
  Array4<const_int> local_230;
  long local_1f0;
  long local_1e8;
  Periodicity local_1e0;
  Box local_1d4;
  undefined1 local_1b8 [8];
  FabArrayBase *pFStack_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8 [15];
  
  if (this->m_masks_built == false) {
    this->m_is_bottom_singular = false;
    this->m_masks_built = true;
    paVar1 = (this->super_MLLinOp).m_lobc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1b8._0_4_ = 0x65;
    paVar8 = (pointer)std::
                      __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                                (paVar1,paVar1 + 1,local_1b8);
    paVar1 = (this->super_MLLinOp).m_hibc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_1b8._0_4_ = 0x65;
    paVar9 = (pointer)std::
                      __find_if<amrex::LinOpBCType*,__gnu_cxx::__ops::_Iter_equals_val<amrex::LinOpBCType_const>>
                                (paVar1,paVar1 + 1,local_1b8);
    paVar1 = (this->super_MLLinOp).m_lobc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((paVar8 == paVar1 + 1) &&
       (paVar9 == (this->super_MLLinOp).m_hibc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1)) {
      bVar14 = this->m_overset_dirichlet_mask ^ 1;
      if (*(this->super_MLLinOp).m_domain_covered.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
          0) {
        bVar14 = false;
      }
      this->m_is_bottom_singular = (bool)bVar14;
    }
    local_340.arr[2] = paVar1->_M_elems[2];
    local_340.arr._0_8_ = *(undefined8 *)paVar1->_M_elems;
    paVar1 = (this->super_MLLinOp).m_hibc.
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             .
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_350.arr[2] = paVar1->_M_elems[2];
    local_350.arr._0_8_ = *(undefined8 *)paVar1->_M_elems;
    local_2f8 = local_350.arr[2];
    local_2f4 = local_340.arr[2];
    local_2b0 = this;
    if (0 < (this->super_MLLinOp).m_num_amr_levels) {
      lVar19 = 0;
      local_2fc = local_340.arr[0] ^ Dirichlet;
      local_304 = local_350.arr[0] ^ Dirichlet;
      local_300 = local_340.arr[1] ^ Dirichlet;
      local_308 = local_350.arr[1] ^ Dirichlet;
      do {
        if (0 < (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar19]) {
          local_2c0 = lVar19 * 3;
          local_1e8 = lVar19 * 0x18;
          lVar24 = 0;
          local_1f0 = lVar19;
          do {
            lVar19 = *(long *)((long)&(((this->super_MLLinOp).m_geom.
                                        super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                        .
                                        super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                      ).
                                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                              + local_2c0 * 8);
            local_1e0 = Geometry::periodicity((Geometry *)(lVar19 + lVar24 * 200));
            lVar19 = lVar19 + lVar24 * 200;
            local_2e8 = *(undefined8 *)(((Box *)(lVar19 + 0xac))->smallend).vect;
            local_2dc[1] = (LinOpBCType)((ulong)*(undefined8 *)(lVar19 + 0xb8) >> 0x20);
            uStack_2d4 = *(undefined8 *)(lVar19 + 0xc0);
            local_2e0 = (undefined4)*(undefined8 *)(lVar19 + 0xb4);
            local_2dc[0] = (LinOpBCType)((ulong)*(undefined8 *)(lVar19 + 0xb4) >> 0x20);
            lVar10 = 0;
            do {
              if ((uStack_2d4._4_4_ >> ((uint)lVar10 & 0x1f) & 1) == 0) {
                local_2dc[lVar10] = local_2dc[lVar10] + 1;
              }
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            uStack_2d4 = CONCAT44(7,(int)uStack_2d4);
            local_358 = *(FabArray<amrex::IArrayBox> **)
                         (*(long *)((long)&(((this->m_dirichlet_mask).
                                             super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                             .
                                             super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                           ).
                                           super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                   + local_1e8) + lVar24 * 8);
            local_2a8._0_8_ =
                 (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
                 0x1;
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_2a8._8_8_ = (FabArrayBase *)0x0;
            local_298.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_3b0.p = (int *)&PTR__FabFactory_0074f4c0;
            iMultiFab::iMultiFab
                      ((iMultiFab *)local_1b8,
                       (BoxArray *)
                       (lVar24 * 0x68 +
                       *(long *)((long)&(((this->super_MLLinOp).m_grids.
                                          super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                        ).
                                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                + local_1e8)),
                       (DistributionMapping *)
                       (lVar24 * 0x10 +
                       *(long *)((long)&(((this->super_MLLinOp).m_dmap.
                                          super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                          .
                                          super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                        ).
                                        super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                + local_1e8)),1,1,(MFInfo *)local_2a8,
                       (FabFactory<amrex::IArrayBox> *)&local_3b0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_298);
            FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
                      ((FabArray<amrex::IArrayBox> *)local_1b8,(Box *)(lVar19 + 0xac),&local_1e0,0,1
                       ,2,0);
            local_244.do_tiling = false;
            local_244.num_streams = Gpu::Device::max_gpu_streams;
            local_244.tilesize.vect[0] = 0;
            local_244.tilesize.vect[1] = 0;
            local_244.tilesize.vect[2] = 0;
            local_244.dynamic = true;
            local_244.device_sync = true;
            local_2b8 = lVar24;
            if ((lVar24 != 0) && (this->m_overset_dirichlet_mask != false)) {
              local_2a8._0_8_ =
                   (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
                   0x200000002;
              local_2a8._8_4_ = 2;
              average_down_nodal<amrex::IArrayBox>
                        (*(FabArray<amrex::IArrayBox> **)
                          (*(long *)((long)&(((this->m_dirichlet_mask).
                                              super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                              .
                                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                            ).
                                            super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                                    + local_2c0 * 8) + -8 + lVar24 * 8),local_358,
                         (IntVect *)local_2a8,0,false);
            }
            MFIter::MFIter((MFIter *)local_2a8,&local_358->super_FabArrayBase,&local_244);
            if ((int)local_298.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage < local_280) {
              local_360._M_head_impl._0_4_ = (undefined4)local_2e8;
              local_330._M_head_impl._0_4_ = local_2e8._4_4_;
              local_310 = CONCAT44(local_310._4_4_,local_2e0);
              local_318[0] = local_2dc[0];
              local_2ec = local_2dc[1];
              local_2f0 = (int)uStack_2d4;
              do {
                BATransformer::operator()
                          (&local_1d4,(BATransformer *)(local_2a8._8_8_ + 8),
                           (Box *)((long)(local_270->super_vector<int,_std::allocator<int>_>).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start
                                         [(int)local_298.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage] *
                                   0x1c + *(long *)(((BoxArray *)(local_2a8._8_8_ + 8))->m_ref).
                                                                                                      
                                                  super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr));
                FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                          (&local_3b0,local_358,(MFIter *)local_2a8);
                FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                          (&local_230,(FabArray<amrex::IArrayBox> *)local_1b8,(MFIter *)local_2a8);
                this = local_2b0;
                uVar11 = (ulong)(uint)local_1d4.smallend.vect[1];
                if (local_1d4.smallend.vect[2] <= local_1d4.bigend.vect[2]) {
                  iVar17 = local_1d4.smallend.vect[2];
                  do {
                    if (local_1d4.smallend.vect[1] <= local_1d4.bigend.vect[1]) {
                      uVar12 = uVar11;
                      do {
                        iVar16 = (int)uVar12;
                        if (local_1d4.smallend.vect[0] <= local_1d4.bigend.vect[0]) {
                          local_368 = (FabArrayBase *)CONCAT44(local_230.p._4_4_,(int)local_230.p);
                          local_370._M_t.
                          super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                          .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
                               (tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)
                               CONCAT44(local_230.jstride._4_4_,(int)local_230.jstride);
                          local_320 = (pointer)CONCAT44(local_230.kstride._4_4_,
                                                        (int)local_230.kstride);
                          iVar18 = local_1d4.smallend.vect[0];
                          do {
                            lVar24 = ((long)iVar17 - (long)local_3b0.begin.z) * local_3b0.kstride;
                            lVar19 = (long)(iVar18 - local_3b0.begin.x) * 4 +
                                     ((long)iVar16 - (long)local_3b0.begin.y) *
                                     CONCAT44(local_3b0.jstride._4_4_,(int)local_3b0.jstride) * 4;
                            if (*(int *)((long)local_3b0.p + lVar24 * 4 + lVar19) == 0) {
                              lVar10 = (long)(~local_230.begin.x + iVar18);
                              lVar22 = (long)(~local_230.begin.y + iVar16) *
                                       (long)local_370._M_t.
                                             super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                             .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                             _M_head_impl;
                              lVar20 = (long)(~local_230.begin.z + iVar17) * (long)local_320;
                              uVar15 = 1;
                              if (((IntVect *)&local_368->_vptr_FabArrayBase)->vect
                                  [lVar22 + lVar10 + lVar20] != 1) {
                                lVar21 = (long)(iVar18 - local_230.begin.x);
                                if (((IntVect *)&local_368->_vptr_FabArrayBase)->vect
                                    [lVar22 + lVar21 + lVar20] != 1) {
                                  lVar23 = (long)(iVar16 - local_230.begin.y) *
                                           (long)local_370._M_t.
                                                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                                 .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                                 _M_head_impl;
                                  if ((((((IntVect *)&local_368->_vptr_FabArrayBase)->vect
                                         [lVar23 + lVar10 + lVar20] != 1) &&
                                       (((IntVect *)&local_368->_vptr_FabArrayBase)->vect
                                        [lVar23 + lVar21 + lVar20] != 1)) &&
                                      (lVar20 = (long)(iVar17 - local_230.begin.z) * (long)local_320
                                      , ((IntVect *)&local_368->_vptr_FabArrayBase)->vect
                                        [lVar22 + lVar10 + lVar20] != 1)) &&
                                     ((((IntVect *)&local_368->_vptr_FabArrayBase)->vect
                                       [lVar22 + lVar21 + lVar20] != 1 &&
                                      (((IntVect *)&local_368->_vptr_FabArrayBase)->vect
                                       [lVar23 + lVar10 + lVar20] != 1)))) {
                                    uVar15 = (uint)(((IntVect *)&local_368->_vptr_FabArrayBase)->
                                                    vect[lVar23 + lVar21 + lVar20] == 1);
                                  }
                                }
                              }
                              *(uint *)((long)local_3b0.p + lVar24 * 4 + lVar19) = uVar15;
                            }
                            iVar18 = iVar18 + 1;
                          } while (local_1d4.bigend.vect[0] + 1 != iVar18);
                        }
                        uVar12 = (ulong)(iVar16 + 1);
                      } while (iVar16 != local_1d4.bigend.vect[1]);
                    }
                    bVar25 = iVar17 != local_1d4.bigend.vect[2];
                    iVar17 = iVar17 + 1;
                    local_328 = uVar11;
                  } while (bVar25);
                }
                if (local_1d4.smallend.vect[2] <= local_1d4.bigend.vect[2] &&
                    (local_1d4.smallend.vect[0] == (int)local_360._M_head_impl &&
                    local_2fc == interior)) {
                  iVar17 = local_1d4.smallend.vect[2];
                  do {
                    uVar12 = uVar11;
                    if (local_1d4.smallend.vect[1] <= local_1d4.bigend.vect[1]) {
                      do {
                        *(undefined4 *)
                         ((long)local_3b0.p +
                         ((long)iVar17 - (long)local_3b0.begin.z) * local_3b0.kstride * 4 +
                         ((long)local_1d4.smallend.vect[0] - (long)local_3b0.begin.x) * 4 +
                         (long)((int)uVar12 - local_3b0.begin.y) *
                         CONCAT44(local_3b0.jstride._4_4_,(int)local_3b0.jstride) * 4) = 1;
                        uVar15 = (int)uVar12 + 1;
                        uVar12 = (ulong)uVar15;
                      } while (local_1d4.bigend.vect[1] + 1U != uVar15);
                    }
                    bVar25 = iVar17 != local_1d4.bigend.vect[2];
                    iVar17 = iVar17 + 1;
                  } while (bVar25);
                }
                if (local_1d4.smallend.vect[2] <= local_1d4.bigend.vect[2] &&
                    (local_1d4.bigend.vect[0] == local_318[0] && local_304 == interior)) {
                  iVar17 = local_1d4.smallend.vect[2];
                  do {
                    uVar12 = uVar11;
                    if (local_1d4.smallend.vect[1] <= local_1d4.bigend.vect[1]) {
                      do {
                        *(undefined4 *)
                         ((long)local_3b0.p +
                         ((long)iVar17 - (long)local_3b0.begin.z) * local_3b0.kstride * 4 +
                         ((long)local_1d4.bigend.vect[0] - (long)local_3b0.begin.x) * 4 +
                         (long)((int)uVar12 - local_3b0.begin.y) *
                         CONCAT44(local_3b0.jstride._4_4_,(int)local_3b0.jstride) * 4) = 1;
                        uVar15 = (int)uVar12 + 1;
                        uVar12 = (ulong)uVar15;
                      } while (local_1d4.bigend.vect[1] + 1U != uVar15);
                    }
                    bVar25 = iVar17 != local_1d4.bigend.vect[2];
                    iVar17 = iVar17 + 1;
                  } while (bVar25);
                }
                if (local_1d4.smallend.vect[2] <= local_1d4.bigend.vect[2] &&
                    (local_1d4.smallend.vect[1] == (uint)local_330._M_head_impl &&
                    local_300 == interior)) {
                  iVar17 = local_1d4.smallend.vect[2];
                  do {
                    iVar16 = local_1d4.smallend.vect[0];
                    if (local_1d4.smallend.vect[0] <= local_1d4.bigend.vect[0]) {
                      do {
                        *(undefined4 *)
                         ((long)local_3b0.p +
                         ((long)iVar17 - (long)local_3b0.begin.z) * local_3b0.kstride * 4 +
                         (long)(iVar16 - local_3b0.begin.x) * 4 +
                         ((long)local_1d4.smallend.vect[1] - (long)local_3b0.begin.y) *
                         CONCAT44(local_3b0.jstride._4_4_,(int)local_3b0.jstride) * 4) = 1;
                        iVar16 = iVar16 + 1;
                      } while (local_1d4.bigend.vect[0] + 1 != iVar16);
                    }
                    bVar25 = iVar17 != local_1d4.bigend.vect[2];
                    iVar17 = iVar17 + 1;
                  } while (bVar25);
                }
                if (local_1d4.smallend.vect[2] <= local_1d4.bigend.vect[2] &&
                    (local_1d4.bigend.vect[1] == local_2ec && local_308 == interior)) {
                  iVar17 = local_1d4.smallend.vect[2];
                  do {
                    iVar16 = local_1d4.smallend.vect[0];
                    if (local_1d4.smallend.vect[0] <= local_1d4.bigend.vect[0]) {
                      do {
                        *(undefined4 *)
                         ((long)local_3b0.p +
                         ((long)iVar17 - (long)local_3b0.begin.z) * local_3b0.kstride * 4 +
                         (long)(iVar16 - local_3b0.begin.x) * 4 +
                         ((long)local_1d4.bigend.vect[1] - (long)local_3b0.begin.y) *
                         CONCAT44(local_3b0.jstride._4_4_,(int)local_3b0.jstride) * 4) = 1;
                        iVar16 = iVar16 + 1;
                      } while (local_1d4.bigend.vect[0] + 1 != iVar16);
                    }
                    bVar25 = iVar17 != local_1d4.bigend.vect[2];
                    iVar17 = iVar17 + 1;
                  } while (bVar25);
                }
                if (local_1d4.smallend.vect[1] <= local_1d4.bigend.vect[1] &&
                    (local_1d4.smallend.vect[2] == (int)local_310 && local_2f4 == Dirichlet)) {
                  uVar12 = uVar11;
                  do {
                    iVar16 = (int)uVar12;
                    iVar17 = local_1d4.smallend.vect[0];
                    if (local_1d4.smallend.vect[0] <= local_1d4.bigend.vect[0]) {
                      do {
                        *(undefined4 *)
                         ((long)local_3b0.p +
                         ((long)local_1d4.smallend.vect[2] - (long)local_3b0.begin.z) *
                         local_3b0.kstride * 4 +
                         (long)(iVar17 - local_3b0.begin.x) * 4 +
                         ((long)iVar16 - (long)local_3b0.begin.y) *
                         CONCAT44(local_3b0.jstride._4_4_,(int)local_3b0.jstride) * 4) = 1;
                        iVar17 = iVar17 + 1;
                      } while (local_1d4.bigend.vect[0] + 1 != iVar17);
                    }
                    uVar12 = (ulong)(iVar16 + 1);
                  } while (iVar16 != local_1d4.bigend.vect[1]);
                }
                if (local_1d4.smallend.vect[1] <= local_1d4.bigend.vect[1] &&
                    (local_1d4.bigend.vect[2] == local_2f0 && local_2f8 == Dirichlet)) {
                  do {
                    iVar16 = (int)uVar11;
                    iVar17 = local_1d4.smallend.vect[0];
                    if (local_1d4.smallend.vect[0] <= local_1d4.bigend.vect[0]) {
                      do {
                        *(undefined4 *)
                         ((long)local_3b0.p +
                         ((long)local_1d4.bigend.vect[2] - (long)local_3b0.begin.z) *
                         local_3b0.kstride * 4 +
                         (long)(iVar17 - local_3b0.begin.x) * 4 +
                         ((long)iVar16 - (long)local_3b0.begin.y) *
                         CONCAT44(local_3b0.jstride._4_4_,(int)local_3b0.jstride) * 4) = 1;
                        iVar17 = iVar17 + 1;
                      } while (local_1d4.bigend.vect[0] + 1 != iVar17);
                    }
                    uVar11 = (ulong)(iVar16 + 1);
                  } while (iVar16 != local_1d4.bigend.vect[1]);
                }
                MFIter::operator++((MFIter *)local_2a8);
              } while ((int)local_298.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage < local_280);
            }
            MFIter::~MFIter((MFIter *)local_2a8);
            iMultiFab::~iMultiFab((iMultiFab *)local_1b8);
            lVar24 = local_2b8 + 1;
            lVar19 = local_1f0;
          } while (lVar24 < (this->super_MLLinOp).m_num_mg_levels.
                            super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_1f0]);
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 < (this->super_MLLinOp).m_num_amr_levels);
    }
    LVar4 = local_340.arr[2];
    iVar17 = (this->super_MLLinOp).m_num_amr_levels;
    if (iVar17 < 2) {
      uVar11 = (ulong)(iVar17 - 1);
    }
    else {
      local_318[0] = local_340.arr[0];
      local_318[1] = local_340.arr[1];
      lVar19 = 0;
      do {
        local_360._M_head_impl =
             *(iMultiFab **)
              &(this->m_cc_fine_mask).
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        local_330._M_head_impl =
             *(iMultiFab **)
              &(this->m_nd_fine_mask).
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
        _Var2.
        super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
        .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
             (this->m_has_fine_bndry).
             super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
             super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
        ;
        local_368 = (FabArrayBase *)
                    (*(long *)&(this->super_MLLinOp).m_geom.
                               super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar19].
                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                    + 0xac);
        iVar17 = (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[lVar19];
        if ((iVar17 != 2) && (iVar17 != 4)) {
          Assert_host("AMRRefRatio(amrlev) == 2 || AMRRefRatio(amrlev) == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLinOp.cpp"
                      ,0x149,"\"ref_ratio != 2 and 4 not supported\"");
        }
        cmf._M_head_impl = local_360._M_head_impl;
        local_370._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (this->m_cc_fine_mask).
             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar19 + 1]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t;
        local_2a8._0_8_ =
             *(undefined8 *)
              ((IntVect *)((long)&(local_360._M_head_impl)->super_FabArray<amrex::IArrayBox> + 0xc0)
              )->vect;
        local_2a8._8_4_ =
             *(int *)((long)&(local_360._M_head_impl)->super_FabArray<amrex::IArrayBox> + 200);
        local_3b0.jstride._0_4_ =
             (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             [lVar19];
        local_3b0.p = (int *)CONCAT44((int)local_3b0.jstride,(int)local_3b0.jstride);
        local_310 = lVar19;
        PVar26 = Geometry::periodicity
                           (*(Geometry **)
                             &(this->super_MLLinOp).m_geom.
                              super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar19].
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)
        ;
        local_230.p._0_4_ = PVar26.period.vect[0];
        local_230.p._4_4_ = PVar26.period.vect[1];
        local_230.jstride._0_4_ = PVar26.period.vect[2];
        makeFineMask<amrex::IArrayBox>
                  ((iMultiFab *)local_1b8,&(cmf._M_head_impl)->super_FabArray<amrex::IArrayBox>,
                   (FabArray<amrex::IArrayBox> *)
                   local_370._M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                   (IntVect *)local_2a8,(IntVect *)&local_3b0,(Periodicity *)&local_230,0,1,
                   (LayoutData<int> *)
                   _Var2.
                   super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                   .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl);
        FabArray<amrex::IArrayBox>::operator=
                  (&(cmf._M_head_impl)->super_FabArray<amrex::IArrayBox>,
                   (FabArray<amrex::IArrayBox> *)local_1b8);
        iMultiFab::~iMultiFab((iMultiFab *)local_1b8);
        MFIter::MFIter((MFIter *)local_1b8,(FabArrayBase *)cmf._M_head_impl,'\0');
        aLVar5 = local_318;
        domain = local_368;
        if ((int)local_1a8[0].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
            (int)local_1a8[1].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._0_4_) {
          do {
            BATransformer::operator()
                      ((Box *)&local_3b0,&(pFStack_1b0->boxarray).m_bat,
                       (Box *)((long)*(int *)(*(long *)local_1a8[1].
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + (long)(int)local_1a8[0].
                                                                                                                    
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_ * 4) * 0x1c +
                              *(long *)&(((pFStack_1b0->boxarray).m_ref.
                                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->m_abox).
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data));
            FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                      ((Array4<int> *)local_2a8,
                       &(local_360._M_head_impl)->super_FabArray<amrex::IArrayBox>,
                       (MFIter *)local_1b8);
            aLVar6 = local_318;
            bchi.arr[2] = local_350.arr[2];
            bchi.arr[0] = local_350.arr[0];
            bchi.arr[1] = local_350.arr[1];
            bclo.arr[2] = LVar4;
            local_318[0] = aLVar5[0];
            local_318[1] = aLVar5[1];
            bclo.arr[0] = local_318[0];
            bclo.arr[1] = local_318[1];
            local_318 = aLVar6;
            mlndlap_fillbc_cc<int>
                      ((Box *)&local_3b0,(Array4<int> *)local_2a8,(Box *)domain,bclo,bchi);
            MFIter::operator++((MFIter *)local_1b8);
          } while ((int)local_1a8[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
                   (int)local_1a8[1].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_);
        }
        MFIter::~MFIter((MFIter *)local_1b8);
        MFIter::MFIter((MFIter *)local_1b8,(FabArrayBase *)local_330._M_head_impl,true);
        while( true ) {
          if ((int)local_1a8[1].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_4_ <=
              (int)local_1a8[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) break;
          MFIter::tilebox((Box *)&local_230,(MFIter *)local_1b8);
          FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
                    ((Array4<int> *)local_2a8,
                     &(local_330._M_head_impl)->super_FabArray<amrex::IArrayBox>,(MFIter *)local_1b8
                    );
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_3b0,
                     &(local_360._M_head_impl)->super_FabArray<amrex::IArrayBox>,(MFIter *)local_1b8
                    );
          local_358 = (FabArray<amrex::IArrayBox> *)
                      CONCAT44(local_358._4_4_,local_230.kstride._4_4_);
          if ((int)local_230.jstride <= local_230.kstride._4_4_) {
            local_328 = (ulong)local_230.jstride._4_4_;
            iVar17 = (int)local_230.jstride;
            do {
              if (local_230.p._4_4_ <= (int)local_230.kstride) {
                iVar16 = local_230.p._4_4_;
                do {
                  if ((int)local_230.p <= (int)local_230.jstride._4_4_) {
                    local_368 = (FabArrayBase *)local_2a8._0_8_;
                    local_370._M_t.
                    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                    .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
                         (tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)
                         (tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)
                         local_2a8._8_8_;
                    local_320 = local_298.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                    iVar18 = (int)local_230.p;
                    do {
                      iVar7 = iVar18 - local_3b0.begin.x;
                      lVar24 = (long)(~local_3b0.begin.y + iVar16) *
                               CONCAT44(local_3b0.jstride._4_4_,(int)local_3b0.jstride);
                      lVar20 = (~local_3b0.begin.z + iVar17) * local_3b0.kstride;
                      lVar19 = (long)(iVar7 + -1) * 4 + lVar24 * 4;
                      lVar24 = (long)iVar7 * 4 + lVar24 * 4;
                      lVar22 = (long)(iVar16 - local_3b0.begin.y) *
                               CONCAT44(local_3b0.jstride._4_4_,(int)local_3b0.jstride);
                      lVar10 = (long)(iVar7 + -1) * 4 + lVar22 * 4;
                      lVar22 = (long)iVar7 * 4 + lVar22 * 4;
                      lVar21 = (iVar17 - local_3b0.begin.z) * local_3b0.kstride;
                      iVar7 = *(int *)((long)local_3b0.p + lVar20 * 4 + lVar24) +
                              *(int *)((long)local_3b0.p + lVar20 * 4 + lVar19) +
                              *(int *)((long)local_3b0.p + lVar20 * 4 + lVar10) +
                              *(int *)((long)local_3b0.p + lVar20 * 4 + lVar22) +
                              *(int *)((long)local_3b0.p + lVar21 * 4 + lVar19) +
                              *(int *)((long)local_3b0.p + lVar21 * 4 + lVar24) +
                              *(int *)((long)local_3b0.p + lVar21 * 4 + lVar10) +
                              *(int *)((long)local_3b0.p + lVar21 * 4 + lVar22);
                      if (iVar7 != 0) {
                        if (iVar7 == 8) {
                          iVar7 = 2;
                        }
                        else {
                          iVar7 = 1;
                        }
                      }
                      ((IntVect *)local_2a8._0_8_)->vect
                      [((long)iVar16 -
                       (long)local_298.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                       local_2a8._8_8_ +
                       (long)(iVar18 - (int)local_298.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage) +
                       ((long)iVar17 - (long)local_280) *
                       (long)local_298.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start] = iVar7;
                      iVar18 = iVar18 + 1;
                    } while (local_230.jstride._4_4_ + 1 != iVar18);
                  }
                  bVar25 = iVar16 != (int)local_230.kstride;
                  iVar16 = iVar16 + 1;
                } while (bVar25);
              }
              bVar25 = iVar17 != local_230.kstride._4_4_;
              iVar17 = iVar17 + 1;
            } while (bVar25);
          }
          MFIter::operator++((MFIter *)local_1b8);
        }
        lVar19 = local_310 + 1;
        MFIter::~MFIter((MFIter *)local_1b8);
        uVar11 = (long)(local_2b0->super_MLLinOp).m_num_amr_levels - 1;
        this = local_2b0;
      } while (lVar19 < (long)uVar11);
    }
    _Var2.
    super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>.
    _M_t.
    super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>.
    super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
         (this->m_has_fine_bndry).
         super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[(int)uVar11]._M_t.
         super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
    ;
    MFIter::MFIter((MFIter *)local_1b8,
                   (FabArrayBase *)
                   _Var2.
                   super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                   .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl,'\0');
    if ((int)local_1a8[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
        (int)local_1a8[1].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_4_) {
      do {
        ppbVar13 = &local_1a8[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (local_1a8[2].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          ppbVar13 = (pointer *)
                     ((long)(int)local_1a8[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ * 4 +
                     *(long *)local_1a8[2].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        }
        *(undefined4 *)
         ((long)((FabArrayBase *)
                ((long)_Var2.
                       super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                       .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl + 0xf0))
                ->_vptr_FabArrayBase + (long)*(int *)ppbVar13 * 4) = 0;
        MFIter::operator++((MFIter *)local_1b8);
      } while ((int)local_1a8[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ <
               (int)local_1a8[1].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_);
    }
    MFIter::~MFIter((MFIter *)local_1b8);
    iVar17 = *(this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    lVar19 = *(long *)&(((this->super_MLLinOp).m_geom.
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
    piVar3 = (this->m_owner_mask_bottom)._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
             super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
    local_1b8 = (undefined1  [8])0x1;
    pFStack_1b0 = (FabArrayBase *)0x0;
    local_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a8._0_8_ = &PTR__FabFactory_0074e8d0;
    MultiFab::define(&this->m_bottom_dot_mask,
                     (BoxArray *)
                     ((long)&(piVar3->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8),
                     (DistributionMapping *)
                     ((long)&(piVar3->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 0x70),1
                     ,0,(MFInfo *)local_1b8,(FabFactory<amrex::FArrayBox> *)local_2a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_1a8);
    anon_unknown_1::MLNodeLinOp_set_dot_mask
              (&this->m_bottom_dot_mask,piVar3,(Geometry *)((long)iVar17 * 200 + lVar19 + -200),
               &local_340,&local_350,this->m_coarsening_strategy);
    if (this->m_is_bottom_singular == true) {
      piVar3 = (this->m_owner_mask_top)._M_t.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
               super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
      geom = *(Geometry **)
              &(((this->super_MLLinOp).m_geom.
                 super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      local_1b8 = (undefined1  [8])0x1;
      pFStack_1b0 = (FabArrayBase *)0x0;
      local_1a8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2a8._0_8_ = &PTR__FabFactory_0074e8d0;
      MultiFab::define(&this->m_coarse_dot_mask,
                       (BoxArray *)
                       ((long)&(piVar3->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 8),
                       (DistributionMapping *)
                       ((long)&(piVar3->super_FabArray<amrex::IArrayBox>).super_FabArrayBase + 0x70)
                       ,1,0,(MFInfo *)local_1b8,(FabFactory<amrex::FArrayBox> *)local_2a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_1a8);
      anon_unknown_1::MLNodeLinOp_set_dot_mask
                (&this->m_coarse_dot_mask,piVar3,geom,&local_340,&local_350,
                 this->m_coarsening_strategy);
    }
  }
  return;
}

Assistant:

void
MLNodeLinOp::buildMasks ()
{
    if (m_masks_built) return;

    BL_PROFILE("MLNodeLinOp::buildMasks()");

    m_masks_built = true;

    m_is_bottom_singular = false;
    auto itlo = std::find(m_lobc[0].begin(), m_lobc[0].end(), BCType::Dirichlet);
    auto ithi = std::find(m_hibc[0].begin(), m_hibc[0].end(), BCType::Dirichlet);
    if (itlo == m_lobc[0].end() && ithi == m_hibc[0].end())
    {  // No Dirichlet
        m_is_bottom_singular = (m_domain_covered[0] && !m_overset_dirichlet_mask);
    }

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            const Geometry& geom = m_geom[amrlev][mglev];
            const auto& period = geom.periodicity();
            const Box& ccdomain = geom.Domain();
            const Box& nddomain = amrex::surroundingNodes(ccdomain);

            auto& dmask = *m_dirichlet_mask[amrlev][mglev];

            iMultiFab ccm(m_grids[amrlev][mglev],m_dmap[amrlev][mglev],1,1);
            ccm.BuildMask(ccdomain,period,0,1,2,0);

            MFItInfo mfi_info;
            if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

            if (m_overset_dirichlet_mask && mglev > 0) {
                const auto& dmask_fine = *m_dirichlet_mask[amrlev][mglev-1];
                amrex::average_down_nodal(dmask_fine, dmask, IntVect(2));
            }
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(dmask, mfi_info); mfi.isValid(); ++mfi)
            {
                const Box& ndbx = mfi.validbox();
                Array4<int> const& mskarr = dmask.array(mfi);
                Array4<int const> const& ccarr = ccm.const_array(mfi);
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( ndbx, tbx,
                {
                    mlndlap_set_dirichlet_mask(tbx, mskarr, ccarr, nddomain, lobc, hibc);
                });
            }
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels-1; ++amrlev)
    {
        iMultiFab& cc_mask = *m_cc_fine_mask[amrlev];
        iMultiFab& nd_mask = *m_nd_fine_mask[amrlev];
        LayoutData<int>& has_cf = *m_has_fine_bndry[amrlev];
        const Box& ccdom = m_geom[amrlev][0].Domain();

        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(AMRRefRatio(amrlev) == 2 || AMRRefRatio(amrlev) == 4,
                                         "ref_ratio != 2 and 4 not supported");

        cc_mask = amrex::makeFineMask(cc_mask, *m_cc_fine_mask[amrlev+1], cc_mask.nGrowVect(),
                                      IntVect(AMRRefRatio(amrlev)), m_geom[amrlev][0].periodicity(),
                                      0, 1, has_cf); // coarse: 0, fine: 1

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(cc_mask); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.validbox();
            Array4<int> const& fab = cc_mask.array(mfi);
            mlndlap_fillbc_cc<int>(bx,fab,ccdom,lobc,hibc);
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(nd_mask,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<int> const& nmsk = nd_mask.array(mfi);
            Array4<int const> const& cmsk = cc_mask.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_set_nodal_mask(i,j,k,nmsk,cmsk);
            });
        }
    }

    auto& has_cf = *m_has_fine_bndry[m_num_amr_levels-1];
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
    for (MFIter mfi(has_cf); mfi.isValid(); ++mfi)
    {
        has_cf[mfi] = 0;
    }

    {
        int amrlev = 0;
        int mglev = m_num_mg_levels[amrlev]-1;
        const Geometry& geom = m_geom[amrlev][mglev];
        const iMultiFab& omask = *m_owner_mask_bottom;
        m_bottom_dot_mask.define(omask.boxArray(), omask.DistributionMap(), 1, 0);
        MLNodeLinOp_set_dot_mask(m_bottom_dot_mask, omask, geom, lobc, hibc, m_coarsening_strategy);
    }

    if (m_is_bottom_singular)
    {
        int amrlev = 0;
        int mglev = 0;
        const Geometry& geom = m_geom[amrlev][mglev];
        const iMultiFab& omask = *m_owner_mask_top;
        m_coarse_dot_mask.define(omask.boxArray(), omask.DistributionMap(), 1, 0);
        MLNodeLinOp_set_dot_mask(m_coarse_dot_mask, omask, geom, lobc, hibc, m_coarsening_strategy);
    }
}